

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

int N_VInvTestLocal_ManyVector(N_Vector x,N_Vector z)

{
  int iVar1;
  long *in_RSI;
  long *in_RDI;
  int subval;
  int val;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  bool local_2a;
  bool local_29;
  uint local_24;
  long local_20;
  
  local_24 = 1;
  for (local_20 = 0; local_20 < *(long *)*in_RDI; local_20 = local_20 + 1) {
    if (*(long *)(*(long *)(*(long *)(*(long *)(*in_RDI + 0x10) + local_20 * 8) + 8) + 0x160) == 0)
    {
      iVar1 = N_VInvTest(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_20 * 8),
                         *(undefined8 *)(*(long *)(*in_RSI + 0x10) + local_20 * 8));
      local_2a = local_24 != 0 && iVar1 != 0;
      local_29 = local_2a;
    }
    else {
      iVar1 = N_VInvTestLocal(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_20 * 8),
                              *(undefined8 *)(*(long *)(*in_RSI + 0x10) + local_20 * 8));
      local_29 = local_24 != 0 && iVar1 != 0;
    }
    local_24 = (uint)local_29;
  }
  return local_24;
}

Assistant:

sunbooleantype MVAPPEND(N_VInvTestLocal)(N_Vector x, N_Vector z)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  sunbooleantype val, subval;

  /* initialize output*/
  val = SUNTRUE;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* check for nvinvtestlocal in subvector */
    if (MANYVECTOR_SUBVEC(x, i)->ops->nvinvtestlocal)
    {
      subval = N_VInvTestLocal(MANYVECTOR_SUBVEC(x, i), MANYVECTOR_SUBVEC(z, i));
      SUNCheckLastErrNoRet();
      val = (val && subval);

      /* otherwise, call nvinvtest and accumulate to overall val */
    }
    else
    {
      subval = N_VInvTest(MANYVECTOR_SUBVEC(x, i), MANYVECTOR_SUBVEC(z, i));
      SUNCheckLastErrNoRet();
      val = (val && subval);
    }
  }

  return (val);
}